

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kfindxx.cpp
# Opt level: O1

void parse_range(int *min,int *max,string *range)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  undefined8 uVar5;
  int iVar6;
  long *plVar7;
  long *local_60;
  long *local_58 [2];
  long local_48 [2];
  int *local_38;
  
  lVar3 = std::__cxx11::string::find((char)range,0x2d);
  if (lVar3 == -1) {
    plVar7 = (long *)(range->_M_dataplus)._M_p;
    piVar4 = __errno_location();
    iVar6 = *piVar4;
    *piVar4 = 0;
    lVar3 = strtol((char *)plVar7,(char **)local_58,10);
    if (local_58[0] != plVar7) {
      iVar2 = (int)lVar3;
      if ((iVar2 == lVar3) && (*piVar4 != 0x22)) {
        if (*piVar4 == 0) {
          *piVar4 = iVar6;
        }
        *max = iVar2;
        *min = iVar2;
        return;
      }
      goto LAB_00102818;
    }
  }
  else {
    local_38 = max;
    std::__cxx11::string::substr((ulong)local_58,(ulong)range);
    plVar7 = local_58[0];
    piVar4 = __errno_location();
    iVar6 = *piVar4;
    *piVar4 = 0;
    lVar3 = strtol((char *)plVar7,(char **)&local_60,10);
    if (local_60 == plVar7) {
      std::__throw_invalid_argument("stoi");
LAB_001027e8:
      std::__throw_out_of_range("stoi");
LAB_001027f4:
      std::__throw_invalid_argument("stoi");
    }
    else {
      if (((int)lVar3 != lVar3) || (*piVar4 == 0x22)) goto LAB_001027e8;
      if (*piVar4 == 0) {
        *piVar4 = iVar6;
      }
      *min = (int)lVar3;
      plVar7 = local_48;
      if (local_58[0] != plVar7) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      std::__cxx11::string::substr((ulong)local_58,(ulong)range);
      plVar1 = local_58[0];
      iVar6 = *piVar4;
      *piVar4 = 0;
      lVar3 = strtol((char *)local_58[0],(char **)&local_60,10);
      if (local_60 == plVar1) goto LAB_001027f4;
      if ((0xfffffffeffffffff < lVar3 - 0x80000000U) && (*piVar4 != 0x22)) {
        if (*piVar4 == 0) {
          *piVar4 = iVar6;
        }
        *local_38 = (int)lVar3;
        if (local_58[0] == plVar7) {
          return;
        }
        operator_delete(local_58[0],local_48[0] + 1);
        return;
      }
    }
    iVar6 = (int)plVar7;
    std::__throw_out_of_range("stoi");
  }
  std::__throw_invalid_argument("stoi");
LAB_00102818:
  uVar5 = std::__throw_out_of_range("stoi");
  if (*piVar4 == 0) {
    *piVar4 = iVar6;
  }
  _Unwind_Resume(uVar5);
}

Assistant:

void
parse_range(int& min, int& max, const std::string& range)
{
    std::size_t dash_pos = range.find('-');

    if (dash_pos == std::string::npos) {
        // Expecting single number.
        min = max = std::stoi(range);
    } else {
        // Expecting two numbers separated by a dash.
        min = std::stoi(range.substr(0, dash_pos));
        max = std::stoi(range.substr(dash_pos + 1, range.length() - dash_pos - 1));
    }
}